

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall CTcGramProdEntry::move_alts_to(CTcGramProdEntry *this,CTcGramProdEntry *new_entry)

{
  CTcGramProdAlt *this_00;
  CTcGramProdAlt *in_RDI;
  CTcGramProdAlt *nxt;
  CTcGramProdAlt *alt;
  CTcGramProdAlt *local_18;
  
  local_18 = (CTcGramProdAlt *)in_RDI->dict_;
  while (local_18 != (CTcGramProdAlt *)0x0) {
    this_00 = CTcGramProdAlt::get_next(local_18);
    CTcGramProdAlt::set_next(local_18,(CTcGramProdAlt *)0x0);
    add_alt((CTcGramProdEntry *)this_00,in_RDI);
    local_18 = this_00;
  }
  in_RDI->obj_sym_ = (CTcSymObj *)0x0;
  in_RDI->dict_ = (CTcDictEntry *)0x0;
  return;
}

Assistant:

void CTcGramProdEntry::move_alts_to(CTcGramProdEntry *new_entry)
{
    CTcGramProdAlt *alt;
    CTcGramProdAlt *nxt;

    /* move each of my alternatives */
    for (alt = alt_head_ ; alt != 0 ; alt = nxt)
    {
        /* remember the next alternative, since we're unlinking this one */
        nxt = alt->get_next();

        /* unlink this one from the list */
        alt->set_next(0);

        /* link this one into the new owner's list */
        new_entry->add_alt(alt);
    }

    /* there's nothing left in our list */
    alt_head_ = alt_tail_ = 0;
}